

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::ChromeHistogramSample> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::ChromeHistogramSample>::operator=
          (CopyablePtr<perfetto::protos::gen::ChromeHistogramSample> *this,
          CopyablePtr<perfetto::protos::gen::ChromeHistogramSample> *other)

{
  type pCVar1;
  type this_00;
  CopyablePtr<perfetto::protos::gen::ChromeHistogramSample> *other_local;
  CopyablePtr<perfetto::protos::gen::ChromeHistogramSample> *this_local;
  
  pCVar1 = perfetto::std::
           unique_ptr<perfetto::protos::gen::ChromeHistogramSample,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
           ::operator*(&other->ptr_);
  this_00 = perfetto::std::
            unique_ptr<perfetto::protos::gen::ChromeHistogramSample,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
            ::operator*(&this->ptr_);
  perfetto::protos::gen::ChromeHistogramSample::operator=(this_00,pCVar1);
  return this;
}

Assistant:

CopyablePtr& operator=(const CopyablePtr& other) {
    *ptr_ = *other.ptr_;
    return *this;
  }